

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dumper.c
# Opt level: O1

void yaml_emitter_anchor_node(yaml_emitter_t *emitter,int index)

{
  yaml_node_t *pyVar1;
  yaml_anchors_t *pyVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  
  pyVar1 = (emitter->document->nodes).start;
  pyVar2 = emitter->anchors;
  iVar3 = index + -1;
  iVar4 = pyVar2[iVar3].references;
  pyVar2[iVar3].references = iVar4 + 1;
  if (iVar4 == 1) {
    iVar4 = emitter->last_anchor_id + 1;
    emitter->last_anchor_id = iVar4;
    pyVar2[iVar3].anchor = iVar4;
  }
  else if (iVar4 == 0) {
    if (pyVar1[(long)index + -1].type == YAML_MAPPING_NODE) {
      for (piVar5 = pyVar1[(long)index + -1].data.sequence.items.start;
          piVar5 < pyVar1[(long)index + -1].data.sequence.items.top; piVar5 = piVar5 + 2) {
        yaml_emitter_anchor_node(emitter,*piVar5);
        yaml_emitter_anchor_node(emitter,piVar5[1]);
      }
    }
    else if (pyVar1[(long)index + -1].type == YAML_SEQUENCE_NODE) {
      for (piVar5 = pyVar1[(long)index + -1].data.sequence.items.start;
          piVar5 < pyVar1[(long)index + -1].data.sequence.items.top; piVar5 = piVar5 + 1) {
        yaml_emitter_anchor_node(emitter,*piVar5);
      }
    }
  }
  return;
}

Assistant:

static void
yaml_emitter_anchor_node(yaml_emitter_t *emitter, int index)
{
    yaml_node_t *node = emitter->document->nodes.start + index - 1;
    yaml_node_item_t *item;
    yaml_node_pair_t *pair;

    emitter->anchors[index-1].references ++;

    if (emitter->anchors[index-1].references == 1) {
        switch (node->type) {
            case YAML_SEQUENCE_NODE:
                for (item = node->data.sequence.items.start;
                        item < node->data.sequence.items.top; item ++) {
                    yaml_emitter_anchor_node(emitter, *item);
                }
                break;
            case YAML_MAPPING_NODE:
                for (pair = node->data.mapping.pairs.start;
                        pair < node->data.mapping.pairs.top; pair ++) {
                    yaml_emitter_anchor_node(emitter, pair->key);
                    yaml_emitter_anchor_node(emitter, pair->value);
                }
                break;
            default:
                break;
        }
    }

    else if (emitter->anchors[index-1].references == 2) {
        emitter->anchors[index-1].anchor = (++ emitter->last_anchor_id);
    }
}